

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_cleanup_one(APITests *this)

{
  long in_RDI;
  allocator local_61;
  string local_60 [40];
  string *in_stack_ffffffffffffffc8;
  allocator in_stack_ffffffffffffffd7;
  string local_28 [40];
  
  GPIO::setmode(BOARD);
  GPIO::setup(*(int *)(in_RDI + 0x24),IN,-1);
  GPIO::cleanup(*(int *)(in_RDI + 0x24));
  GPIO::getmode();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",(allocator *)&stack0xffffffffffffffd7);
  assert::is_true((bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  GPIO::cleanup();
  GPIO::getmode();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  assert::is_true((bool)in_stack_ffffffffffffffd7,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void test_cleanup_one()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::cleanup(pin_data.in_a);
        assert::is_true(GPIO::getmode() == GPIO::BOARD);
        GPIO::cleanup();
        assert::is_true(GPIO::getmode() == GPIO::NumberingModes::None);
    }